

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric::~IfcLightSourceGoniometric
          (IfcLightSourceGoniometric *this)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *puVar2;
  size_type *psVar3;
  
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x80 = 0x934f50;
  *(undefined8 *)&(this->super_IfcLightSource).AmbientIntensity.have = 0x934ff0;
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x90 = 0x934f78;
  *(undefined8 *)&this[-1].ColourAppearance.have = 0x934fa0;
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x934fc8;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (this->super_IfcLightSource).AmbientIntensity.ptr;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcLightSource).field_0x38;
  puVar1 = &(this->super_IfcLightSource).field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x80 = 0x9350c8;
  *(undefined8 *)&(this->super_IfcLightSource).AmbientIntensity.have = 0x935140;
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x90 = 0x9350f0;
  *(undefined8 *)&this[-1].ColourAppearance.have = 0x935118;
  psVar3 = &this[-1].LightEmissionSource._M_string_length;
  if ((size_type *)this[-1].LuminousFlux != psVar3) {
    operator_delete((undefined1 *)this[-1].LuminousFlux,*psVar3 + 1);
  }
  operator_delete(&this[-1].super_IfcLightSource.field_0x80,0x100);
  return;
}

Assistant:

IfcLightSourceGoniometric() : Object("IfcLightSourceGoniometric") {}